

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Boolean MA_free_heap(Integer memhandle)

{
  AD *in_RAX;
  Boolean BVar1;
  AD *pAVar2;
  AD *ad;
  
  ma_stats.calls[3] = ma_stats.calls[3] + 1;
  ad = in_RAX;
  BVar1 = mh2ad(memhandle,&ad,BL_Heap,"MA_free_heap");
  if (BVar1 == 0) {
    BVar1 = 0;
  }
  else {
    if (ma_trace != 0) {
      printf("MA: freeing \'%s\'\n",ad->name);
    }
    pAVar2 = list_delete(ad,&ma_hused);
    if (pAVar2 == ad) {
      ma_stats.hblocks = ma_stats.hblocks - 1;
      ma_stats.hbytes = ma_stats.hbytes - ad->nbytes;
      block_free_heap(ad);
      ma_table_deallocate(memhandle);
      BVar1 = 1;
    }
    else {
      BVar1 = 0;
      sprintf(ma_ebuf,"memhandle %ld (name: \'%s\') not on heap used list",memhandle,ad->name);
      ma_error(EL_Nonfatal,ET_Internal,"MA_free_heap",ma_ebuf);
    }
  }
  return BVar1;
}

Assistant:

public Boolean MA_free_heap(Integer memhandle) /* the block to deallocate */
{
    AD        *ad;        /* AD for memhandle */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_free_heap]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (!mh2ad(memhandle, &ad, BL_Heap, "MA_free_heap"))
        return MA_FALSE;

    if (ma_trace) 
    (void)printf("MA: freeing '%s'\n", ad->name);

    /* delete block from used list */
    if (list_delete(ad, &ma_hused) != ad)
    {
        (void)sprintf(ma_ebuf,
            "memhandle %ld (name: '%s') not on heap used list",
            (size_t)memhandle, ad->name);
        ma_error(EL_Nonfatal, ET_Internal, "MA_free_heap", ma_ebuf);
        return MA_FALSE;
    }

#ifdef STATS
    ma_stats.hblocks--;
    ma_stats.hbytes -= ad->nbytes;
#endif /* STATS */

    /* reclaim the deallocated block */
    block_free_heap(ad);

    /* free memhandle */
    ma_table_deallocate(memhandle);

    /* success */
    return MA_TRUE;
}